

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O3

LY_ERR lyd_diff_reverse_remove_op_r(lyd_node *diff,lyd_diff_op op)

{
  ushort uVar1;
  lyd_node_inner *plVar2;
  LY_ERR in_EAX;
  lyd_diff_op lVar3;
  LY_ERR extraout_EAX;
  lyd_node *plVar4;
  lyd_meta *meta;
  char *str;
  lyd_node *plVar5;
  lyd_node_inner *plVar6;
  lys_module *plVar7;
  
  plVar5 = diff;
  if (diff != (lyd_node *)0x0) {
    while( true ) {
      do {
        plVar4 = plVar5;
        meta = lyd_find_meta(plVar4->meta,(lys_module *)0x0,"yang:operation");
        if (meta != (lyd_meta *)0x0) {
          str = (meta->value)._canonical;
          if (str == (char *)0x0) {
            str = lyd_value_get_canonical(meta->annotation->module->ctx,&meta->value);
          }
          lVar3 = lyd_diff_str2op(str);
          if (lVar3 != op) {
            if (diff->schema == (lysc_node *)0x0) {
              plVar7 = (lys_module *)&diff[2].schema;
            }
            else {
              plVar7 = diff->schema->module;
            }
            ly_log(plVar7->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                   0x8b5);
            return extraout_EAX;
          }
          lyd_free_meta_single(meta);
        }
      } while (((plVar4->schema == (lysc_node *)0x0) ||
               (uVar1 = plVar4->schema->nodetype, plVar5 = (lyd_node *)(ulong)uVar1,
               (uVar1 & 0x711) != 0)) &&
              (plVar5 = *(lyd_node **)(plVar4 + 1), plVar5 != (lyd_node *)0x0));
      in_EAX = (LY_ERR)plVar5;
      if (plVar4 == diff) break;
      plVar5 = plVar4->next;
      if (plVar4->next == (lyd_node *)0x0) {
        plVar5 = (lyd_node *)0x0;
        plVar6 = plVar4->parent;
        do {
          plVar2 = (plVar6->field_0).node.parent;
          if (plVar2 == diff->parent) {
            return (LY_ERR)plVar5;
          }
          plVar5 = (plVar6->field_0).node.next;
          plVar6 = plVar2;
        } while (plVar5 == (lyd_node *)0x0);
      }
    }
  }
  return in_EAX;
}

Assistant:

static LY_ERR
lyd_diff_reverse_remove_op_r(struct lyd_node *diff, enum lyd_diff_op op)
{
    struct lyd_node *elem;
    struct lyd_meta *meta;

    LYD_TREE_DFS_BEGIN(diff, elem) {
        meta = lyd_find_meta(elem->meta, NULL, "yang:operation");
        if (meta) {
            LY_CHECK_ERR_RET(lyd_diff_str2op(lyd_get_meta_value(meta)) != op, LOGINT(LYD_CTX(diff)), LY_EINT);
            lyd_free_meta_single(meta);
        }

        LYD_TREE_DFS_END(diff, elem);
    }

    return LY_SUCCESS;
}